

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

lys_node *
read_yin_choice(lys_module *module,lys_node *parent,lyxml_elem *yin,int options,unres_schema *unres)

{
  ly_ctx *ctx;
  lyxml_elem *plVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  lys_node *child;
  lys_module *module_00;
  lys_node *plVar7;
  lys_when *plVar8;
  lys_iffeature *plVar9;
  lys_ext_instance **pplVar10;
  char *pcVar11;
  ushort uVar12;
  LYS_NODE type;
  LY_VLOG_ELEM LVar13;
  LY_ECODE LVar14;
  char *pcVar15;
  lyxml_elem *plVar16;
  int local_6c;
  lyxml_elem *local_40;
  
  ctx = module->ctx;
  child = (lys_node *)calloc(1,0x78);
  if (child == (lys_node *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","read_yin_choice");
    return (lys_node *)0x0;
  }
  child->nodetype = LYS_CHOICE;
  child->prev = child;
  iVar5 = 0x19;
  if ((options & 2U) == 0) {
    iVar5 = (uint)((options & 1U) == 0) * 4 + 0x13;
  }
  iVar5 = read_yin_common(module,parent,child,LYEXT_PAR_NODE,yin,iVar5,unres);
  if (iVar5 == 0) {
    ly_log_dbg(4,"parsing %s statement \"%s\"",yin->name,child->name);
    module_00 = lys_main_module(module);
    iVar5 = lys_node_addchild(parent,module_00,child,options);
    if (iVar5 == 0) {
      if (yin->child == (lyxml_elem *)0x0) {
        local_40 = (lyxml_elem *)0x0;
      }
      else {
        iVar5 = 0;
        local_6c = 0;
        bVar4 = false;
        local_40 = (lyxml_elem *)0x0;
        plVar16 = yin->child;
        do {
          plVar1 = plVar16->next;
          iVar6 = strcmp(plVar16->ns->value,"urn:ietf:params:xml:ns:yang:yin:1");
          if (iVar6 != 0) {
            if (iVar5 != 0xff) {
              iVar5 = iVar5 + 1;
              goto LAB_001352b3;
            }
            pcVar11 = "extensions";
LAB_001355e6:
            ly_log(ctx,LY_LLERR,LY_EINT,"Reached limit (%lu) for storing %s in %s statement.",0xff,
                   pcVar11,"choice");
            goto LAB_00134ff4;
          }
          pcVar11 = plVar16->name;
          iVar6 = strcmp(pcVar11,"container");
          if (iVar6 == 0) {
            plVar7 = read_yin_container(module,child,plVar16,options,unres);
LAB_0013529e:
            if (plVar7 == (lys_node *)0x0) goto LAB_00134ff4;
LAB_001352a7:
            lyxml_free(ctx,plVar16);
          }
          else {
            iVar6 = strcmp(pcVar11,"leaf-list");
            if (iVar6 == 0) {
              plVar7 = read_yin_leaflist(module,child,plVar16,options,unres);
              goto LAB_0013529e;
            }
            iVar6 = strcmp(pcVar11,"leaf");
            if (iVar6 == 0) {
              plVar7 = read_yin_leaf(module,child,plVar16,options,unres);
              goto LAB_0013529e;
            }
            iVar6 = strcmp(pcVar11,"list");
            if (iVar6 == 0) {
              plVar7 = read_yin_list(module,child,plVar16,options,unres);
              goto LAB_0013529e;
            }
            iVar6 = strcmp(pcVar11,"case");
            if (iVar6 == 0) {
              plVar7 = read_yin_case(module,child,plVar16,options,unres);
              goto LAB_0013529e;
            }
            iVar6 = strcmp(pcVar11,"anyxml");
            if (iVar6 == 0) {
              type = LYS_ANYXML;
LAB_00135291:
              plVar7 = read_yin_anydata(module,child,plVar16,type,options,unres);
              goto LAB_0013529e;
            }
            iVar6 = strcmp(pcVar11,"anydata");
            if (iVar6 == 0) {
              type = LYS_ANYDATA;
              goto LAB_00135291;
            }
            iVar6 = strcmp(pcVar11,"default");
            if (iVar6 != 0) {
              iVar6 = strcmp(pcVar11,"mandatory");
              if (iVar6 == 0) {
                if (bVar4) goto LAB_001356d3;
                pcVar11 = lyxml_get_attr(plVar16,"value",(char *)0x0);
                if (pcVar11 == (char *)0x0) {
                  pcVar15 = plVar16->name;
                  pcVar11 = "value";
                  LVar14 = LYE_MISSARG;
                  LVar13 = LY_VLOG_NONE;
                  plVar7 = (lys_node *)0x0;
                  goto LAB_00135736;
                }
                iVar6 = strcmp(pcVar11,"true");
                if (iVar6 == 0) {
                  uVar12 = 0x40;
                }
                else {
                  iVar6 = strcmp(pcVar11,"false");
                  uVar12 = 0x80;
                  if (iVar6 != 0) {
                    pcVar15 = plVar16->name;
                    LVar14 = LYE_INARG;
                    goto LAB_001356f0;
                  }
                }
                child->flags = child->flags | uVar12;
                bVar4 = true;
                iVar6 = lyp_yin_parse_subnode_ext
                                  (module,child,LYEXT_PAR_NODE,plVar16,LYEXT_SUBSTMT_MANDATORY,'\0',
                                   unres);
                if (iVar6 == 0) goto LAB_001352a7;
                goto LAB_00134ff4;
              }
              iVar6 = strcmp(pcVar11,"when");
              if (iVar6 == 0) {
                lVar2._0_1_ = child->hash[0];
                lVar2._1_1_ = child->hash[1];
                lVar2._2_1_ = child->hash[2];
                lVar2._3_1_ = child->hash[3];
                lVar2._4_4_ = *(undefined4 *)&child->field_0x6c;
                if (lVar2 != 0) {
                  pcVar15 = yin->name;
                  LVar14 = LYE_TOOMANY;
                  goto LAB_001356f0;
                }
                plVar8 = read_yin_when(module,plVar16,unres);
                *(lys_when **)child->hash = plVar8;
                if (plVar8 != (lys_when *)0x0) goto LAB_001352a7;
                goto LAB_00134ff4;
              }
              iVar6 = strcmp(pcVar11,"if-feature");
              if (iVar6 == 0) {
                if (local_6c == 0xff) {
                  pcVar11 = "if-features";
                  goto LAB_001355e6;
                }
                local_6c = local_6c + 1;
                goto LAB_001352b3;
              }
              if (((module->field_0x40 & 0xc) != 0) &&
                 (iVar6 = strcmp(pcVar11,"choice"), iVar6 == 0)) {
                plVar7 = read_yin_choice(module,child,plVar16,options,unres);
                goto LAB_0013529e;
              }
              LVar14 = LYE_INSTMT;
              LVar13 = LY_VLOG_LYS;
              plVar7 = child;
              goto LAB_0013569d;
            }
            if (local_40 != (lyxml_elem *)0x0) {
LAB_001356d3:
              pcVar15 = yin->name;
              LVar14 = LYE_TOOMANY;
LAB_001356f0:
              LVar13 = LY_VLOG_LYS;
              plVar7 = child;
LAB_00135736:
              ly_vlog(ctx,LVar14,LVar13,plVar7,pcVar11,pcVar15);
              goto LAB_00134ff4;
            }
            iVar6 = lyp_yin_parse_subnode_ext
                              (module,child,LYEXT_PAR_NODE,plVar16,LYEXT_SUBSTMT_DEFAULT,'\0',unres)
            ;
            if (iVar6 != 0) {
              local_40 = (lyxml_elem *)0x0;
              goto LAB_00134ff4;
            }
            lyxml_unlink_elem(ctx,plVar16,0);
            local_40 = plVar16;
          }
LAB_001352b3:
          plVar16 = plVar1;
        } while (plVar1 != (lyxml_elem *)0x0);
        if (local_6c != 0) {
          plVar9 = (lys_iffeature *)calloc((long)local_6c,0x20);
          child->iffeature = plVar9;
          if (plVar9 != (lys_iffeature *)0x0) goto LAB_00135470;
LAB_00135644:
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","read_yin_choice");
          goto LAB_00134ff4;
        }
LAB_00135470:
        if (iVar5 != 0) {
          pplVar10 = (lys_ext_instance **)
                     realloc(child->ext,((ulong)child->ext_size + (long)iVar5) * 8);
          if (pplVar10 == (lys_ext_instance **)0x0) goto LAB_00135644;
          child->ext = pplVar10;
          memset(pplVar10 + child->ext_size,0,(long)iVar5 << 3);
        }
        if (yin->child != (lyxml_elem *)0x0) {
          plVar16 = yin->child;
          do {
            plVar1 = plVar16->next;
            iVar5 = strcmp(plVar16->ns->value,"urn:ietf:params:xml:ns:yang:yin:1");
            if (iVar5 == 0) {
              iVar5 = fill_yin_iffeature(child,0,plVar16,child->iffeature + child->iffeature_size,
                                         unres);
              child->iffeature_size = child->iffeature_size + '\x01';
            }
            else {
              iVar5 = lyp_yin_fill_ext(child,LYEXT_PAR_NODE,LYEXT_SUBSTMT_SELF,'\0',module,plVar16,
                                       &child->ext,child->ext_size,unres);
              child->ext_size = child->ext_size + '\x01';
            }
            if (iVar5 != 0) goto LAB_00134ff4;
            plVar16 = plVar1;
          } while (plVar1 != (lyxml_elem *)0x0);
        }
        if (local_40 == (lyxml_elem *)0x0) {
          local_40 = (lyxml_elem *)0x0;
        }
        else {
          if ((child->flags & 0x40) != 0) {
            ly_vlog(ctx,LYE_INCHILDSTMT,LY_VLOG_LYS,child,"default","choice");
            pcVar11 = "The \"default\" statement is forbidden on choices with \"mandatory\".";
            LVar14 = LYE_SPEC;
            LVar13 = LY_VLOG_PREV;
            plVar7 = (lys_node *)0x0;
LAB_0013569d:
            ly_vlog(ctx,LVar14,LVar13,plVar7,pcVar11);
            goto LAB_00134ff4;
          }
          pcVar11 = lyxml_get_attr(local_40,"value",(char *)0x0);
          if (pcVar11 == (char *)0x0) {
            ly_vlog(ctx,LYE_MISSARG,LY_VLOG_NONE,(void *)0x0,"value",local_40->name);
            goto LAB_00134ff4;
          }
          iVar5 = unres_schema_add_str(module,unres,child,UNRES_CHOICE_DFLT,pcVar11);
          if (iVar5 == -1) goto LAB_00134ff4;
          lyxml_free(ctx,local_40);
        }
      }
      if (((ctx->models).flags & 2) != 0) {
        return child;
      }
      lVar3._0_1_ = child->hash[0];
      lVar3._1_1_ = child->hash[1];
      lVar3._2_1_ = child->hash[2];
      lVar3._3_1_ = child->hash[3];
      lVar3._4_4_ = *(undefined4 *)&child->field_0x6c;
      if (lVar3 == 0) {
        return child;
      }
      if ((options & 4U) == 0) {
        iVar5 = unres_schema_add_node(module,unres,child,UNRES_XPATH,(lys_node *)0x0);
        if (iVar5 != -1) {
          return child;
        }
      }
      else {
        iVar5 = lyxp_node_check_syntax(child);
        if (iVar5 == 0) {
          return child;
        }
      }
      goto LAB_00134ff4;
    }
  }
  local_40 = (lyxml_elem *)0x0;
LAB_00134ff4:
  lyxml_free(ctx,local_40);
  lys_node_free(child,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
  return (lys_node *)0x0;
}

Assistant:

static struct lys_node *
read_yin_choice(struct lys_module *module, struct lys_node *parent, struct lyxml_elem *yin, int options,
                struct unres_schema *unres)
{
    struct lyxml_elem *sub, *next, *dflt = NULL;
    struct ly_ctx *const ctx = module->ctx;
    struct lys_node *retval, *node = NULL;
    struct lys_node_choice *choice;
    const char *value;
    int f_mand = 0, c_ftrs = 0, c_ext = 0, ret;
    void *reallocated;

    choice = calloc(1, sizeof *choice);
    LY_CHECK_ERR_RETURN(!choice, LOGMEM(ctx), NULL);

    choice->nodetype = LYS_CHOICE;
    choice->prev = (struct lys_node *)choice;
    retval = (struct lys_node *)choice;

    if (read_yin_common(module, parent, retval, LYEXT_PAR_NODE, yin,
            OPT_IDENT | OPT_MODULE | ((options & LYS_PARSE_OPT_CFG_IGNORE) ? OPT_CFG_IGNORE :
                (options & LYS_PARSE_OPT_CFG_NOINHERIT) ? OPT_CFG_PARSE : OPT_CFG_PARSE | OPT_CFG_INHERIT),
            unres)) {
        goto error;
    }

    LOGDBG(LY_LDGYIN, "parsing %s statement \"%s\"", yin->name, retval->name);

    /* insert the node into the schema tree */
    if (lys_node_addchild(parent, lys_main_module(module), retval, options)) {
        goto error;
    }

    /* process choice's specific children */
    LY_TREE_FOR_SAFE(yin->child, next, sub) {
        if (strcmp(sub->ns->value, LY_NSYIN)) {
            /* extension */
            YIN_CHECK_ARRAY_OVERFLOW_GOTO(ctx, c_ext, retval->ext_size, "extensions", "choice", error);
            c_ext++;
            /* keep it for later processing, skip lyxml_free() */
            continue;
        } else if (!strcmp(sub->name, "container")) {
            if (!(node = read_yin_container(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "leaf-list")) {
            if (!(node = read_yin_leaflist(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "leaf")) {
            if (!(node = read_yin_leaf(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "list")) {
            if (!(node = read_yin_list(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "case")) {
            if (!(node = read_yin_case(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "anyxml")) {
            if (!(node = read_yin_anydata(module, retval, sub, LYS_ANYXML, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "anydata")) {
            if (!(node = read_yin_anydata(module, retval, sub, LYS_ANYDATA, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "default")) {
            if (dflt) {
                LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYS, retval, sub->name, yin->name);
                goto error;
            }

            if (lyp_yin_parse_subnode_ext(module, retval, LYEXT_PAR_NODE, sub, LYEXT_SUBSTMT_DEFAULT, 0, unres)) {
                goto error;
            }

            dflt = sub;
            lyxml_unlink_elem(ctx, dflt, 0);
            continue;
            /* skip lyxml_free() at the end of the loop, the sub node is processed later as dflt */

        } else if (!strcmp(sub->name, "mandatory")) {
            if (f_mand) {
                LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYS, retval, sub->name, yin->name);
                goto error;
            }
            /* just checking the flags in leaf is not sufficient, we would allow
             * multiple mandatory statements with the "false" value
             */
            f_mand = 1;

            GETVAL(ctx, value, sub, "value");
            if (!strcmp(value, "true")) {
                choice->flags |= LYS_MAND_TRUE;
            } else if (!strcmp(value, "false")) {
                choice->flags |= LYS_MAND_FALSE;
            } else {
                LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, retval, value, sub->name);
                goto error;
            }                   /* else false is the default value, so we can ignore it */

            if (lyp_yin_parse_subnode_ext(module, retval, LYEXT_PAR_NODE, sub, LYEXT_SUBSTMT_MANDATORY, 0, unres)) {
                goto error;
            }
        } else if (!strcmp(sub->name, "when")) {
            if (choice->when) {
                LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYS, retval, sub->name, yin->name);
                goto error;
            }

            choice->when = read_yin_when(module, sub, unres);
            if (!choice->when) {
                goto error;
            }
        } else if (!strcmp(sub->name, "if-feature")) {
            YIN_CHECK_ARRAY_OVERFLOW_GOTO(ctx, c_ftrs, retval->iffeature_size, "if-features", "choice", error);
            c_ftrs++;

            /* skip lyxml_free() at the end of the loop, the sub node is processed later */
            continue;
        } else if (module->version >= 2 && !strcmp(sub->name, "choice")) {
            if (!(node = read_yin_choice(module, retval, sub, options, unres))) {
                goto error;
            }
        } else {
            LOGVAL(ctx, LYE_INSTMT, LY_VLOG_LYS, retval, sub->name);
            goto error;
        }

        node = NULL;
        lyxml_free(ctx, sub);
    }

    if (c_ftrs) {
        choice->iffeature = calloc(c_ftrs, sizeof *choice->iffeature);
        LY_CHECK_ERR_GOTO(!choice->iffeature, LOGMEM(ctx), error);
    }
    if (c_ext) {
        /* some extensions may be already present from the substatements */
        reallocated = realloc(retval->ext, (c_ext + retval->ext_size) * sizeof *retval->ext);
        LY_CHECK_ERR_GOTO(!reallocated, LOGMEM(ctx), error);
        retval->ext = reallocated;

        /* init memory */
        memset(&retval->ext[retval->ext_size], 0, c_ext * sizeof *retval->ext);
    }

    LY_TREE_FOR_SAFE(yin->child, next, sub) {
        if (strcmp(sub->ns->value, LY_NSYIN)) {
            /* extension */
            ret = lyp_yin_fill_ext(retval, LYEXT_PAR_NODE, 0, 0, module, sub, &retval->ext, retval->ext_size, unres);
            retval->ext_size++;
            if (ret) {
                goto error;
            }
        } else {
            ret = fill_yin_iffeature(retval, 0, sub, &choice->iffeature[choice->iffeature_size], unres);
            choice->iffeature_size++;
            if (ret) {
                goto error;
            }
        }
    }

    /* check - default is prohibited in combination with mandatory */
    if (dflt && (choice->flags & LYS_MAND_TRUE)) {
        LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, retval, "default", "choice");
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "The \"default\" statement is forbidden on choices with \"mandatory\".");
        goto error;
    }

    /* link default with the case */
    if (dflt) {
        GETVAL(ctx, value, dflt, "value");
        if (unres_schema_add_str(module, unres, choice, UNRES_CHOICE_DFLT, value) == -1) {
            goto error;
        }
        lyxml_free(ctx, dflt);
    }

    /* check XPath dependencies */
    if (!(ctx->models.flags & LY_CTX_TRUSTED) && choice->when) {
        if (options & LYS_PARSE_OPT_INGRP) {
            if (lyxp_node_check_syntax(retval)) {
                goto error;
            }
        } else {
            if (unres_schema_add_node(module, unres, retval, UNRES_XPATH, NULL) == -1) {
                goto error;
            }
        }
    }

    return retval;

error:
    lyxml_free(ctx, dflt);
    lys_node_free(retval, NULL, 0);
    return NULL;
}